

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkreplyhttpimpl_p.cpp
# Opt level: O1

int __thiscall
QNetworkReplyHttpImpl::qt_metacall(QNetworkReplyHttpImpl *this,Call _c,int _id,void **_a)

{
  int _id_00;
  
  _id_00 = QNetworkReply::qt_metacall((QNetworkReply *)this,_c,_id,_a);
  if (-1 < _id_00) {
    if (_c == InvokeMetaMethod) {
      if (_id_00 < 0x20) {
        qt_static_metacall((QObject *)this,InvokeMetaMethod,_id_00,_a);
      }
      _id_00 = _id_00 + -0x20;
    }
    if (_c == RegisterMethodArgumentMetaType) {
      if (_id_00 < 0x20) {
        qt_static_metacall((QObject *)this,RegisterMethodArgumentMetaType,_id_00,_a);
      }
      _id_00 = _id_00 + -0x20;
    }
  }
  return _id_00;
}

Assistant:

int QNetworkReplyHttpImpl::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QNetworkReply::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 32)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 32;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 32)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 32;
    }
    return _id;
}